

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O2

bool __thiscall zmq::zmtp_engine_t::handshake_v1_0(zmtp_engine_t *this)

{
  bool bVar1;
  v1_encoder_t *this_00;
  v1_decoder_t *this_01;
  
  bVar1 = session_base_t::zap_enabled((this->super_stream_engine_base_t)._session);
  if (bVar1) {
    stream_engine_base_t::error(&this->super_stream_engine_base_t,protocol_error);
  }
  else {
    this_00 = (v1_encoder_t *)operator_new(0x58,(nothrow_t *)&std::nothrow);
    if (this_00 == (v1_encoder_t *)0x0) {
      (this->super_stream_engine_base_t)._encoder = (i_encoder *)0x0;
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x13e);
      fflush(_stderr);
      zmq_abort("FATAL ERROR: OUT OF MEMORY");
    }
    else {
      v1_encoder_t::v1_encoder_t
                (this_00,(long)(this->super_stream_engine_base_t)._options.out_batch_size);
      (this->super_stream_engine_base_t)._encoder = (i_encoder *)this_00;
    }
    this_01 = (v1_decoder_t *)operator_new(0x90,(nothrow_t *)&std::nothrow);
    if (this_01 == (v1_decoder_t *)0x0) {
      (this->super_stream_engine_base_t)._decoder = (i_decoder *)0x0;
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x142);
      fflush(_stderr);
      zmq_abort("FATAL ERROR: OUT OF MEMORY");
    }
    else {
      v1_decoder_t::v1_decoder_t
                (this_01,(long)(this->super_stream_engine_base_t)._options.in_batch_size,
                 (this->super_stream_engine_base_t)._options.maxmsgsize);
      (this->super_stream_engine_base_t)._decoder = (i_decoder *)this_01;
    }
  }
  return !bVar1;
}

Assistant:

bool zmq::zmtp_engine_t::handshake_v1_0 ()
{
    if (session ()->zap_enabled ()) {
        // reject ZMTP 1.0 connections if ZAP is enabled
        error (protocol_error);
        return false;
    }

    _encoder = new (std::nothrow) v1_encoder_t (_options.out_batch_size);
    alloc_assert (_encoder);

    _decoder = new (std::nothrow)
      v1_decoder_t (_options.in_batch_size, _options.maxmsgsize);
    alloc_assert (_decoder);

    return true;
}